

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O1

void __thiscall
lineage::heuristics::PartitionGraph::
removeVanishedEdges<std::vector<unsigned_long,std::allocator<unsigned_long>>&>
          (PartitionGraph *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *buffer)

{
  unsigned_long *puVar1;
  size_t edge;
  pointer pEVar2;
  pointer puVar3;
  _Hash_node_base _Var4;
  pointer pRVar5;
  _Hash_node_base *p_Var6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  pointer puVar11;
  _Hash_node_base *p_Var12;
  __node_base *p_Var13;
  bool bVar14;
  __node_base *p_Var16;
  pointer pAVar17;
  _Hash_node_base _Var18;
  difference_type __d;
  pointer puVar19;
  bool bVar20;
  bool bVar15;
  
  puVar19 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar11 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar19 != puVar11) {
    uVar9 = (long)puVar11 - (long)puVar19 >> 3;
    lVar7 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar19,puVar11,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar19,puVar11);
  }
  _Var10 = std::
           __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     ((buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start,
                      (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish);
  puVar1 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((_Var10._M_current != puVar1) &&
     (puVar19 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish,
     puVar11 = (pointer)((long)_Var10._M_current + ((long)puVar19 - (long)puVar1)),
     puVar19 != puVar11)) {
    (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar11;
  }
  puVar19 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar19 !=
      (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      edge = puVar19[-1];
      pEVar2 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
               super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->partitions_).
               super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var12 = puVar3[pEVar2[edge].vertexIndices_[0]]._M_h._M_before_begin._M_nxt;
      if (p_Var12 == (_Hash_node_base *)0x0) {
LAB_0013e7da:
        removeEdge(this,edge);
      }
      else {
        p_Var13 = &puVar3[pEVar2[edge].vertexIndices_[1]]._M_h._M_before_begin;
        bVar15 = false;
        bVar14 = false;
        p_Var16 = p_Var13;
LAB_0013e71c:
        do {
          p_Var16 = p_Var16->_M_nxt;
          if (p_Var16 != (__node_base *)0x0) {
            _Var4._M_nxt = p_Var16[1]._M_nxt;
            pRVar5 = (this->data_->problemGraph->graph_).vertices_.
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            p_Var6 = p_Var12[1]._M_nxt;
            _Var18._M_nxt = p_Var6;
            if ((ulong)((long)*(pointer *)((long)(pRVar5 + (long)_Var4._M_nxt) + 8) -
                       *(long *)&pRVar5[(long)_Var4._M_nxt].vector_) <
                (ulong)((long)*(pointer *)((long)(pRVar5 + (long)p_Var6) + 8) -
                       *(long *)&pRVar5[(long)p_Var6].vector_)) {
              _Var18._M_nxt = _Var4._M_nxt;
              _Var4._M_nxt = p_Var6;
            }
            pAVar17 = *(pointer *)&pRVar5[(long)_Var18._M_nxt].vector_;
            uVar9 = (long)*(pointer *)((long)(pRVar5 + (long)_Var18._M_nxt) + 8) - (long)pAVar17 >>
                    4;
            while (uVar8 = uVar9, 0 < (long)uVar8) {
              uVar9 = uVar8 >> 1;
              if (*(_Hash_node_base **)(pAVar17 + uVar9) < _Var4._M_nxt) {
                pAVar17 = pAVar17 + uVar9 + 1;
                uVar9 = ~uVar9 + uVar8;
              }
            }
            if (*(pointer *)((long)(pRVar5 + (long)_Var18._M_nxt) + 8) == pAVar17) {
              bVar20 = false;
            }
            else {
              bVar20 = (_Hash_node_base *)pAVar17->vertex_ == _Var4._M_nxt;
            }
            bVar14 = bVar15;
            if (!bVar20) goto LAB_0013e71c;
            bVar14 = true;
            bVar15 = bVar14;
          }
          p_Var12 = p_Var12->_M_nxt;
          p_Var16 = p_Var13;
        } while (p_Var12 != (_Hash_node_base *)0x0);
        if (!bVar14) goto LAB_0013e7da;
      }
      puVar19 = puVar19 + -1;
    } while (puVar19 !=
             (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void removeVanishedEdges(T&& buffer)
    {
        // Remove duplicates.
        // The second removal would remove an arbitrary other edge!
        std::sort(std::begin(buffer), std::end(buffer));
        auto last = std::unique(std::begin(buffer), std::end(buffer));
        buffer.erase(last, buffer.end());

        for (auto it = buffer.crbegin(); it != buffer.crend(); ++it) {

            bool exists = false;
            for (const auto& a : partitions_[this->vertexOfEdge(*it, 0)]) {
                for (const auto& b : partitions_[this->vertexOfEdge(*it, 1)]) {
                    if (this->data_.problemGraph.graph().findEdge(a, b).first) {
                        exists = true;
                        break;
                    }
                }
            }

            if (!exists) {
                removeEdge(*it);
            }
        }
    }